

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProfiler.cpp
# Opt level: O2

ChProfileNode * __thiscall
chrono::utils::ChProfileNode::Get_Sub_Node(ChProfileNode *this,char *name)

{
  ChProfileNode **ppCVar1;
  ChProfileNode *pCVar2;
  ChProfileNode **ppCVar3;
  
  ppCVar1 = &this->Child;
  ppCVar3 = ppCVar1;
  while( true ) {
    pCVar2 = *ppCVar3;
    if (pCVar2 == (ChProfileNode *)0x0) {
      pCVar2 = (ChProfileNode *)::operator_new(0x38);
      ChProfileNode(pCVar2,name,this);
      pCVar2->Sibling = *ppCVar1;
      *ppCVar1 = pCVar2;
      return pCVar2;
    }
    if (pCVar2->Name == name) break;
    ppCVar3 = &pCVar2->Sibling;
  }
  return pCVar2;
}

Assistant:

ChProfileNode * ChProfileNode::Get_Sub_Node( const char * name )
{
	// Try to find this sub node
	ChProfileNode * child = Child;
	while ( child ) {
		if ( child->Name == name ) {
			return child;
		}
		child = child->Sibling;
	}

	// We didn't find it, so add it
	
	ChProfileNode * node = new ChProfileNode( name, this );
	node->Sibling = Child;
	Child = node;
	return node;
}